

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O3

void fiber_exec_on(Fiber *active,Fiber *temp,FiberFunc f,void *args)

{
  if ((active->state & 1) == 0) {
    __assert_fail("fiber_is_executing(active)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x164,"void fiber_exec_on(Fiber *, Fiber *, FiberFunc, void *)");
  }
  if (active != temp) {
    if ((temp->state & 1) == 0) {
      temp->state = temp->state | 1;
      *(byte *)&active->state = (byte)active->state & 0xfe;
      fiber_asm_exec_on_stack(args,f,(temp->regs).sp);
      *(byte *)&active->state = (byte)active->state | 1;
      *(byte *)&temp->state = (byte)temp->state & 0xfe;
      return;
    }
    __assert_fail("!fiber_is_executing(temp)",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                  0x169,"void fiber_exec_on(Fiber *, Fiber *, FiberFunc, void *)");
  }
  (*f)(args);
  return;
}

Assistant:

void
fiber_exec_on(Fiber *active, Fiber *temp, FiberFunc f, void *args)
{
    NULL_CHECK(active, "Fiber cannot be NULL");
    NULL_CHECK(temp, "Fiber cannot be NULL");
    assert(fiber_is_executing(active));

    if (active == temp) {
        f(args);
    } else {
        assert(!fiber_is_executing(temp));
        temp->state |= FIBER_FS_EXECUTING;
        active->state &= ~FIBER_FS_EXECUTING;
        fiber_asm_exec_on_stack(args, f, temp->regs.sp);
        active->state |= FIBER_FS_EXECUTING;
        temp->state &= ~FIBER_FS_EXECUTING;
    }
}